

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O0

bool __thiscall
basisu::basis_compressor::write_output_files_and_compute_stats(basis_compressor *this)

{
  uint uVar1;
  void *__s1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  undefined8 uVar6;
  uchar *__s2;
  basisu_backend_slice_desc *pbVar7;
  image *this_00;
  long lVar8;
  bool_param *in_RDI;
  image temp_1;
  gpu_image decoded_bc7;
  image temp;
  gpu_image decoded_etc1s_or_astc;
  image best_etc1s_unpacked;
  gpu_image best_etc1s_gpu_image;
  string out_basename;
  uint32_t output_size;
  image_metrics em;
  image_stats *s;
  basisu_backend_slice_desc *slice_desc;
  uint32_t slice_index;
  uint32_t i;
  uint32_t total_texels;
  void *pDecomp_data;
  size_t decomp_size;
  void *pComp_data;
  size_t comp_size;
  string *output_filename;
  uint8_vec *comp_data;
  undefined1 in_stack_00000476;
  undefined1 in_stack_00000477;
  uint32_t in_stack_00000478;
  uint32_t in_stack_0000047c;
  image *in_stack_00000480;
  image *in_stack_00000488;
  image_metrics *in_stack_00000490;
  int in_stack_00002734;
  size_t *in_stack_00002738;
  size_t in_stack_00002740;
  void *in_stack_00002748;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffbdc;
  gpu_image *in_stack_fffffffffffffbe0;
  gpu_image *in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbf0;
  uint32_t in_stack_fffffffffffffbf4;
  gpu_image *in_stack_fffffffffffffbf8;
  image *in_stack_fffffffffffffc00;
  gpu_image *in_stack_fffffffffffffc08;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  gpu_image *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  params *in_stack_fffffffffffffc28;
  string *this_01;
  uint32_t in_stack_fffffffffffffc3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc48;
  uint32_t in_stack_fffffffffffffc4c;
  uint local_34c;
  float local_2f4;
  uint8_vec *local_2d0;
  string local_2c0 [64];
  string local_280 [32];
  gpu_image local_260;
  string local_230 [64];
  string local_1f0 [32];
  gpu_image local_1d0;
  string local_1a0 [64];
  string local_160 [32];
  image *in_stack_fffffffffffffec0;
  gpu_image *in_stack_fffffffffffffec8;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [48];
  string local_a0 [36];
  uint local_7c;
  float local_68;
  float local_64;
  image_stats *local_60;
  basisu_backend_slice_desc *local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  void *local_40;
  ulong local_38;
  void *local_30;
  ulong local_28;
  bool_param *local_20;
  uint8_vec *local_18;
  bool local_1;
  
  debug_printf("basis_compressor::write_output_files_and_compute_stats\n");
  bVar3 = bool_param::operator_cast_to_bool(in_RDI + 0x210);
  if (bVar3) {
    local_2d0 = (uint8_vec *)(in_RDI + 0x6b8);
  }
  else {
    local_2d0 = basisu_file::get_compressed_data((basisu_file *)(in_RDI + 0x5d8));
  }
  local_18 = local_2d0;
  bVar3 = bool_param::operator_cast_to_bool(in_RDI + 0xba);
  if (bVar3) {
    local_20 = in_RDI + 0x48;
    std::__cxx11::string::c_str();
    bVar3 = write_vec_to_file((char *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                              (uint8_vec *)in_stack_fffffffffffffbe8);
    if (!bVar3) {
      uVar6 = std::__cxx11::string::c_str();
      error_printf("Failed writing output data to file \"%s\"\n",uVar6);
      return false;
    }
    bVar3 = bool_param::operator_cast_to_bool(in_RDI + 0x6a);
    if (bVar3) {
      uVar6 = std::__cxx11::string::c_str();
      printf("Wrote output .basis/.ktx2 file \"%s\"\n",uVar6);
    }
  }
  local_28 = 0;
  bVar3 = bool_param::operator_cast_to_bool(in_RDI + 0xbc);
  if (((bVar3) && (bVar3 = bool_param::operator_cast_to_bool(in_RDI), bVar3)) &&
     (uVar5 = vector<unsigned_char>::size(local_18), uVar5 != 0)) {
    vector<unsigned_char>::operator[]
              ((vector<unsigned_char> *)in_stack_fffffffffffffbe0,
               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    vector<unsigned_char>::size(local_18);
    local_30 = buminiz::tdefl_compress_mem_to_heap
                         (in_stack_fffffffffffffc08,(size_t)in_stack_fffffffffffffc00,
                          (size_t *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf4);
    local_38 = 0;
    local_40 = buminiz::tinfl_decompress_mem_to_heap
                         (in_stack_00002748,in_stack_00002740,in_stack_00002738,in_stack_00002734);
    uVar2 = local_38;
    uVar5 = vector<unsigned_char>::size(local_18);
    __s1 = local_40;
    if (uVar2 == uVar5) {
      __s2 = vector<unsigned_char>::operator[]
                       ((vector<unsigned_char> *)in_stack_fffffffffffffbe0,
                        CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      iVar4 = memcmp(__s1,__s2,local_38);
      if (iVar4 == 0) {
        buminiz::mz_free((void *)0x4bffc7);
        buminiz::mz_free((void *)0x4bffd4);
        local_44 = 0;
        for (local_48 = 0; uVar1 = local_48,
            uVar5 = vector<basisu::basisu_backend_slice_desc>::size
                              ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280)),
            uVar1 < uVar5; local_48 = local_48 + 1) {
          pbVar7 = vector<basisu::basisu_backend_slice_desc>::operator[]
                             ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffbe0
                              ,CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
          uVar5 = pbVar7->m_num_blocks_x;
          pbVar7 = vector<basisu::basisu_backend_slice_desc>::operator[]
                             ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffbe0
                              ,CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
          local_44 = uVar5 * pbVar7->m_num_blocks_y * 0x10 + local_44;
        }
        local_2f4 = (float)local_28;
        *(double *)(in_RDI + 0x278) = (double)((local_2f4 * 8.0) / (float)local_44);
        uVar5 = vector<unsigned_char>::size(local_18);
        debug_printf(*(char **)(in_RDI + 0x278),
                     ".basis file size: %u, LZ compressed file size: %u, %3.2f bits/texel\n",
                     (ulong)uVar5,local_28 & 0xffffffff);
        goto LAB_004c014f;
      }
    }
    printf(
          "basis_compressor::create_basis_file_and_transcode:: miniz compression or decompression failed!\n"
          );
    local_1 = false;
  }
  else {
LAB_004c014f:
    vector<basisu::basisu_backend_slice_desc>::size
              ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280));
    vector<basisu::image_stats>::resize
              ((vector<basisu::image_stats> *)
               CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
               (size_t)in_stack_fffffffffffffbe8,SUB81((ulong)in_stack_fffffffffffffbe0 >> 0x38,0));
    bVar3 = bool_param::operator_cast_to_bool(in_RDI + 0x23e);
    if (bVar3) {
      for (local_4c = 0; uVar1 = local_4c,
          uVar5 = vector<basisu::basisu_backend_slice_desc>::size
                            ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280)),
          uVar1 < uVar5; local_4c = local_4c + 1) {
        local_58 = vector<basisu::basisu_backend_slice_desc>::operator[]
                             ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffbe0
                              ,CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
        bVar3 = bool_param::operator_cast_to_bool(in_RDI + 0xbc);
        if (bVar3) {
          printf("Slice: %u\n",(ulong)local_4c);
          local_60 = vector<basisu::image_stats>::operator[]
                               ((vector<basisu::image_stats> *)in_stack_fffffffffffffbe0,
                                CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
          image_metrics::image_metrics((image_metrics *)0x4c026b);
          vector<basisu::image>::operator[]
                    ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                     CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
          vector<basisu::image>::operator[]
                    ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                     CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
          uVar9 = 0;
          image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                              in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                              (bool)in_stack_00000476);
          image_metrics::print
                    ((image_metrics *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                     (char *)in_stack_fffffffffffffbe8);
          local_60->m_basis_rgb_avg_psnr = local_68;
          vector<basisu::image>::operator[]
                    ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                     CONCAT44(in_stack_fffffffffffffbdc,uVar9));
          vector<basisu::image>::operator[]
                    ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                     CONCAT44(in_stack_fffffffffffffbdc,uVar9));
          uVar9 = 0;
          image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                              in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                              (bool)in_stack_00000476);
          image_metrics::print
                    ((image_metrics *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                     (char *)in_stack_fffffffffffffbe8);
          local_60->m_basis_rgba_avg_psnr = local_68;
          vector<basisu::image>::operator[]
                    ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                     CONCAT44(in_stack_fffffffffffffbdc,uVar9));
          vector<basisu::image>::operator[]
                    ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                     CONCAT44(in_stack_fffffffffffffbdc,uVar9));
          uVar9 = 0;
          image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                              in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                              (bool)in_stack_00000476);
          image_metrics::print
                    ((image_metrics *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                     (char *)in_stack_fffffffffffffbe8);
          vector<basisu::image>::operator[]
                    ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                     CONCAT44(in_stack_fffffffffffffbdc,uVar9));
          vector<basisu::image>::operator[]
                    ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                     CONCAT44(in_stack_fffffffffffffbdc,uVar9));
          uVar9 = 0;
          image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                              in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                              (bool)in_stack_00000476);
          image_metrics::print
                    ((image_metrics *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                     (char *)in_stack_fffffffffffffbe8);
          vector<basisu::image>::operator[]
                    ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                     CONCAT44(in_stack_fffffffffffffbdc,uVar9));
          vector<basisu::image>::operator[]
                    ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                     CONCAT44(in_stack_fffffffffffffbdc,uVar9));
          uVar9 = 0;
          image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                              in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                              (bool)in_stack_00000476);
          image_metrics::print
                    ((image_metrics *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                     (char *)in_stack_fffffffffffffbe8);
          bVar3 = bool_param::operator_cast_to_bool(in_RDI);
          if (bVar3) {
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            uVar9 = 0;
            image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                                in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                                (bool)in_stack_00000476);
            image_metrics::print
                      ((image_metrics *)
                       CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       (char *)in_stack_fffffffffffffbe8);
            local_60->m_basis_a_avg_psnr = local_68;
          }
          vector<basisu::image>::operator[]
                    ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                     CONCAT44(in_stack_fffffffffffffbdc,uVar9));
          vector<basisu::image>::operator[]
                    ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                     CONCAT44(in_stack_fffffffffffffbdc,uVar9));
          uVar9 = 0;
          image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                              in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                              (bool)in_stack_00000476);
          image_metrics::print
                    ((image_metrics *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                     (char *)in_stack_fffffffffffffbe8);
          local_60->m_basis_luma_709_psnr = local_68;
          local_60->m_basis_luma_709_ssim = local_64;
          vector<basisu::image>::operator[]
                    ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                     CONCAT44(in_stack_fffffffffffffbdc,uVar9));
          vector<basisu::image>::operator[]
                    ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                     CONCAT44(in_stack_fffffffffffffbdc,uVar9));
          in_stack_fffffffffffffbd8 = 1;
          image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                              in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                              (bool)in_stack_00000476);
          image_metrics::print
                    ((image_metrics *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                     (char *)in_stack_fffffffffffffbe8);
          local_60->m_basis_luma_601_psnr = local_68;
          uVar5 = vector<basisu::basisu_backend_slice_desc>::size
                            ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280));
          if (uVar5 == 1) {
            if (local_28 == 0) {
              local_34c = vector<unsigned_char>::size(local_18);
            }
            else {
              local_34c = (uint)local_28;
            }
            local_7c = local_34c;
            debug_printf((char *)(double)((local_60->m_basis_rgb_avg_psnr * 10000.0) /
                                         (((float)local_34c * 8.0) /
                                         (float)(local_58->m_orig_width * local_58->m_orig_height)))
                         ,".basis RGB PSNR per bit/texel*10000: %3.3f\n");
            debug_printf((char *)(double)((local_60->m_basis_luma_709_psnr * 10000.0) /
                                         (((float)local_7c * 8.0) /
                                         (float)(local_58->m_orig_width * local_58->m_orig_height)))
                         ,".basis Luma 709 PSNR per bit/texel*10000: %3.3f\n");
          }
          this_00 = vector<basisu::image>::operator[]
                              ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
          uVar5 = image::get_width(this_00);
          if (uVar5 != 0) {
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
            uVar9 = 0;
            image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                                in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                                (bool)in_stack_00000476);
            image_metrics::print
                      ((image_metrics *)
                       CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       (char *)in_stack_fffffffffffffbe8);
            local_60->m_bc7_rgb_avg_psnr = local_68;
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            uVar9 = 0;
            image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                                in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                                (bool)in_stack_00000476);
            image_metrics::print
                      ((image_metrics *)
                       CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       (char *)in_stack_fffffffffffffbe8);
            local_60->m_bc7_rgba_avg_psnr = local_68;
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            uVar9 = 0;
            image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                                in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                                (bool)in_stack_00000476);
            image_metrics::print
                      ((image_metrics *)
                       CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       (char *)in_stack_fffffffffffffbe8);
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            uVar9 = 0;
            image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                                in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                                (bool)in_stack_00000476);
            image_metrics::print
                      ((image_metrics *)
                       CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       (char *)in_stack_fffffffffffffbe8);
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            uVar9 = 0;
            image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                                in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                                (bool)in_stack_00000476);
            image_metrics::print
                      ((image_metrics *)
                       CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       (char *)in_stack_fffffffffffffbe8);
            bVar3 = bool_param::operator_cast_to_bool(in_RDI);
            if (bVar3) {
              vector<basisu::image>::operator[]
                        ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                         CONCAT44(in_stack_fffffffffffffbdc,uVar9));
              vector<basisu::image>::operator[]
                        ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                         CONCAT44(in_stack_fffffffffffffbdc,uVar9));
              uVar9 = 0;
              image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                                  in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                                  (bool)in_stack_00000476);
              image_metrics::print
                        ((image_metrics *)
                         CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                         (char *)in_stack_fffffffffffffbe8);
              local_60->m_bc7_a_avg_psnr = local_68;
            }
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            uVar9 = 0;
            image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                                in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                                (bool)in_stack_00000476);
            image_metrics::print
                      ((image_metrics *)
                       CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       (char *)in_stack_fffffffffffffbe8);
            local_60->m_bc7_luma_709_psnr = local_68;
            local_60->m_bc7_luma_709_ssim = local_64;
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            in_stack_fffffffffffffbd8 = 1;
            image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                                in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                                (bool)in_stack_00000476);
            image_metrics::print
                      ((image_metrics *)
                       CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       (char *)in_stack_fffffffffffffbe8);
            local_60->m_bc7_luma_601_psnr = local_68;
          }
          bVar3 = bool_param::operator_cast_to_bool(in_RDI);
          if (!bVar3) {
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
            uVar9 = 0;
            image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                                in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                                (bool)in_stack_00000476);
            image_metrics::print
                      ((image_metrics *)
                       CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       (char *)in_stack_fffffffffffffbe8);
            local_60->m_best_etc1s_rgb_avg_psnr = local_68;
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            uVar9 = 0;
            image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                                in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                                (bool)in_stack_00000476);
            image_metrics::print
                      ((image_metrics *)
                       CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       (char *)in_stack_fffffffffffffbe8);
            local_60->m_best_etc1s_luma_709_psnr = local_68;
            local_60->m_best_etc1s_luma_709_ssim = local_64;
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            vector<basisu::image>::operator[]
                      ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                       CONCAT44(in_stack_fffffffffffffbdc,uVar9));
            in_stack_fffffffffffffbd8 = 1;
            image_metrics::calc(in_stack_00000490,in_stack_00000488,in_stack_00000480,
                                in_stack_0000047c,in_stack_00000478,(bool)in_stack_00000477,
                                (bool)in_stack_00000476);
            image_metrics::print
                      ((image_metrics *)
                       CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       (char *)in_stack_fffffffffffffbe8);
            local_60->m_best_etc1s_luma_601_psnr = local_68;
          }
        }
        std::__cxx11::string::string(local_a0);
        lVar8 = std::__cxx11::string::size();
        if (lVar8 == 0) {
          in_stack_fffffffffffffc4c =
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(in_RDI + 8));
          if (in_stack_fffffffffffffc4c != 0) {
            in_stack_fffffffffffffc40 =
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffffbe0,
                              CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
            std::__cxx11::string::c_str();
            string_get_filename((char *)in_stack_fffffffffffffc18,
                                (string *)
                                CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
          }
        }
        else {
          std::__cxx11::string::c_str();
          string_get_filename((char *)in_stack_fffffffffffffc18,
                              (string *)
                              CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
        }
        string_remove_extension
                  ((string *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
        std::operator+((char *)in_stack_fffffffffffffc28,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
        string_format_abi_cxx11_((char *)local_110,"_slice_%u",(ulong)local_4c);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc18,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
        this_01 = local_d0;
        std::__cxx11::string::operator=(local_a0,this_01);
        std::__cxx11::string::~string(this_01);
        std::__cxx11::string::~string(local_110);
        std::__cxx11::string::~string(local_f0);
        bVar3 = bool_param::operator_cast_to_bool(in_RDI);
        in_stack_fffffffffffffc3c = CONCAT13(bVar3,(int3)in_stack_fffffffffffffc3c);
        if (((!bVar3) &&
            (in_stack_fffffffffffffc28 =
                  basisu_frontend::get_params((basisu_frontend *)(in_RDI + 0x298)),
            (in_stack_fffffffffffffc28->m_debug_images & 1U) != 0)) &&
           (in_stack_fffffffffffffc27 = bool_param::operator_cast_to_bool(in_RDI),
           !(bool)in_stack_fffffffffffffc27)) {
          in_stack_fffffffffffffc18 =
               vector<basisu::gpu_image>::operator[]
                         ((vector<basisu::gpu_image> *)in_stack_fffffffffffffbe0,
                          CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
          gpu_image::gpu_image
                    (in_stack_fffffffffffffbe0,
                     (gpu_image *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
          gpu_image::override_dimensions
                    ((gpu_image *)&stack0xfffffffffffffec0,local_58->m_orig_width,
                     local_58->m_orig_height);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00);
          std::__cxx11::string::c_str();
          write_compressed_texture_file
                    ((char *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                     in_stack_fffffffffffffc08);
          std::__cxx11::string::~string(local_160);
          image::image((image *)0x4c119e);
          gpu_image::unpack(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00);
          save_png((string *)in_stack_fffffffffffffbe0,
                   (image *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),0,0x4c11ee
                  );
          std::__cxx11::string::~string(local_1a0);
          image::~image((image *)0x4c120a);
          gpu_image::~gpu_image((gpu_image *)0x4c1217);
        }
        in_stack_fffffffffffffc17 = bool_param::operator_cast_to_bool(in_RDI + 0x70);
        if ((bool)in_stack_fffffffffffffc17) {
          in_stack_fffffffffffffc08 =
               vector<basisu::gpu_image>::operator[]
                         ((vector<basisu::gpu_image> *)in_stack_fffffffffffffbe0,
                          CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
          gpu_image::gpu_image
                    (in_stack_fffffffffffffbe0,
                     (gpu_image *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
          gpu_image::override_dimensions(&local_1d0,local_58->m_orig_width,local_58->m_orig_height);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00);
          std::__cxx11::string::c_str();
          write_compressed_texture_file
                    ((char *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                     in_stack_fffffffffffffc08);
          std::__cxx11::string::~string(local_1f0);
          in_stack_fffffffffffffc00 =
               vector<basisu::image>::operator[]
                         ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                          CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
          image::image(in_stack_fffffffffffffc00,(image *)in_stack_fffffffffffffbf8);
          image::crop((image *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                      (uint32_t)((ulong)in_stack_fffffffffffffc40 >> 0x20),
                      (uint32_t)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,
                      (color_rgba *)this_01,SUB81((ulong)in_stack_fffffffffffffc28 >> 0x38,0));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00);
          save_png((string *)in_stack_fffffffffffffbe0,
                   (image *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),0,0x4c1457
                  );
          std::__cxx11::string::~string(local_230);
          image::~image((image *)0x4c1473);
          gpu_image::~gpu_image((gpu_image *)0x4c1480);
          in_stack_fffffffffffffbf8 =
               vector<basisu::gpu_image>::operator[]
                         ((vector<basisu::gpu_image> *)in_stack_fffffffffffffbe0,
                          CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
          in_stack_fffffffffffffbf4 = gpu_image::get_pixel_width(in_stack_fffffffffffffbf8);
          if (in_stack_fffffffffffffbf4 != 0) {
            in_stack_fffffffffffffbe8 =
                 vector<basisu::gpu_image>::operator[]
                           ((vector<basisu::gpu_image> *)in_stack_fffffffffffffbe0,
                            CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
            gpu_image::gpu_image
                      (in_stack_fffffffffffffbe0,
                       (gpu_image *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
            gpu_image::override_dimensions
                      (&local_260,local_58->m_orig_width,local_58->m_orig_height);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00);
            std::__cxx11::string::c_str();
            write_compressed_texture_file
                      ((char *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                       in_stack_fffffffffffffc08);
            std::__cxx11::string::~string(local_280);
            in_stack_fffffffffffffbe0 =
                 (gpu_image *)
                 vector<basisu::image>::operator[]
                           ((vector<basisu::image> *)in_stack_fffffffffffffbe0,
                            CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
            image::image(in_stack_fffffffffffffc00,(image *)in_stack_fffffffffffffbf8);
            image::crop((image *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                        (uint32_t)((ulong)in_stack_fffffffffffffc40 >> 0x20),
                        (uint32_t)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,
                        (color_rgba *)this_01,SUB81((ulong)in_stack_fffffffffffffc28 >> 0x38,0));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00);
            save_png((string *)in_stack_fffffffffffffbe0,
                     (image *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),0,
                     0x4c15fe);
            std::__cxx11::string::~string(local_2c0);
            image::~image((image *)0x4c161a);
            gpu_image::~gpu_image((gpu_image *)0x4c1627);
          }
        }
        std::__cxx11::string::~string(local_a0);
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool basis_compressor::write_output_files_and_compute_stats()
	{
		debug_printf("basis_compressor::write_output_files_and_compute_stats\n");

		const uint8_vec& comp_data = m_params.m_create_ktx2_file ? m_output_ktx2_file : m_basis_file.get_compressed_data();
		if (m_params.m_write_output_basis_files)
		{
			const std::string& output_filename = m_params.m_out_filename;

			if (!write_vec_to_file(output_filename.c_str(), comp_data))
			{
				error_printf("Failed writing output data to file \"%s\"\n", output_filename.c_str());
				return false;
			}

			if (m_params.m_status_output)
			{
				printf("Wrote output .basis/.ktx2 file \"%s\"\n", output_filename.c_str());
			}
		}

		size_t comp_size = 0;
		if ((m_params.m_compute_stats) && (m_params.m_uastc) && (comp_data.size()))
		{
			void* pComp_data = tdefl_compress_mem_to_heap(&comp_data[0], comp_data.size(), &comp_size, TDEFL_MAX_PROBES_MASK);// TDEFL_DEFAULT_MAX_PROBES);
			size_t decomp_size = 0;
			void* pDecomp_data = tinfl_decompress_mem_to_heap(pComp_data, comp_size, &decomp_size, 0);
			if ((decomp_size != comp_data.size()) || (memcmp(pDecomp_data, &comp_data[0], decomp_size) != 0))
			{
				printf("basis_compressor::create_basis_file_and_transcode:: miniz compression or decompression failed!\n");
				return false;
			}

			mz_free(pComp_data);
			mz_free(pDecomp_data);

			uint32_t total_texels = 0;
			for (uint32_t i = 0; i < m_slice_descs.size(); i++)
				total_texels += (m_slice_descs[i].m_num_blocks_x * m_slice_descs[i].m_num_blocks_y) * 16;
			
			m_basis_bits_per_texel = comp_size * 8.0f / total_texels;

			debug_printf(".basis file size: %u, LZ compressed file size: %u, %3.2f bits/texel\n",
				(uint32_t)comp_data.size(),
				(uint32_t)comp_size,
				m_basis_bits_per_texel);
		}

		m_stats.resize(m_slice_descs.size());
		
		if (m_params.m_validate_output_data)
		{
			for (uint32_t slice_index = 0; slice_index < m_slice_descs.size(); slice_index++)
			{
				const basisu_backend_slice_desc& slice_desc = m_slice_descs[slice_index];

				if (m_params.m_compute_stats)
				{
					printf("Slice: %u\n", slice_index);

					image_stats& s = m_stats[slice_index];

					// TODO: We used to output SSIM (during heavy encoder development), but this slowed down compression too much. We'll be adding it back.

					image_metrics em;

					// ---- .basis stats
					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 0, 3);
					em.print(".basis RGB Avg:          ");
					s.m_basis_rgb_avg_psnr = em.m_psnr;

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 0, 4);
					em.print(".basis RGBA Avg:         ");
					s.m_basis_rgba_avg_psnr = em.m_psnr;

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 0, 1);
					em.print(".basis R   Avg:          ");

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 1, 1);
					em.print(".basis G   Avg:          ");

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 2, 1);
					em.print(".basis B   Avg:          ");

					if (m_params.m_uastc)
					{
						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 3, 1);
						em.print(".basis A   Avg:          ");

						s.m_basis_a_avg_psnr = em.m_psnr;
					}

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 0, 0);
					em.print(".basis 709 Luma:         ");
					s.m_basis_luma_709_psnr = static_cast<float>(em.m_psnr);
					s.m_basis_luma_709_ssim = static_cast<float>(em.m_ssim);

					em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked[slice_index], 0, 0, true, true);
					em.print(".basis 601 Luma:         ");
					s.m_basis_luma_601_psnr = static_cast<float>(em.m_psnr);

					if (m_slice_descs.size() == 1)
					{
						const uint32_t output_size = comp_size ? (uint32_t)comp_size : (uint32_t)comp_data.size();
						debug_printf(".basis RGB PSNR per bit/texel*10000: %3.3f\n", 10000.0f * s.m_basis_rgb_avg_psnr / ((output_size * 8.0f) / (slice_desc.m_orig_width * slice_desc.m_orig_height)));
						debug_printf(".basis Luma 709 PSNR per bit/texel*10000: %3.3f\n", 10000.0f * s.m_basis_luma_709_psnr / ((output_size * 8.0f) / (slice_desc.m_orig_width * slice_desc.m_orig_height)));
					}

					if (m_decoded_output_textures_unpacked_bc7[slice_index].get_width())
					{
						// ---- BC7 stats
						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 0, 3);
						em.print("BC7 RGB Avg:             ");
						s.m_bc7_rgb_avg_psnr = em.m_psnr;

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 0, 4);
						em.print("BC7 RGBA Avg:            ");
						s.m_bc7_rgba_avg_psnr = em.m_psnr;

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 0, 1);
						em.print("BC7 R   Avg:             ");

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 1, 1);
						em.print("BC7 G   Avg:             ");

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 2, 1);
						em.print("BC7 B   Avg:             ");

						if (m_params.m_uastc)
						{
							em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 3, 1);
							em.print("BC7 A   Avg:             ");

							s.m_bc7_a_avg_psnr = em.m_psnr;
						}

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 0, 0);
						em.print("BC7 709 Luma:            ");
						s.m_bc7_luma_709_psnr = static_cast<float>(em.m_psnr);
						s.m_bc7_luma_709_ssim = static_cast<float>(em.m_ssim);

						em.calc(m_slice_images[slice_index], m_decoded_output_textures_unpacked_bc7[slice_index], 0, 0, true, true);
						em.print("BC7 601 Luma:            ");
						s.m_bc7_luma_601_psnr = static_cast<float>(em.m_psnr);
					}

					if (!m_params.m_uastc)
					{
						// ---- Nearly best possible ETC1S stats
						em.calc(m_slice_images[slice_index], m_best_etc1s_images_unpacked[slice_index], 0, 3);
						em.print("Unquantized ETC1S RGB Avg:     ");
						s.m_best_etc1s_rgb_avg_psnr = static_cast<float>(em.m_psnr);

						em.calc(m_slice_images[slice_index], m_best_etc1s_images_unpacked[slice_index], 0, 0);
						em.print("Unquantized ETC1S 709 Luma:    ");
						s.m_best_etc1s_luma_709_psnr = static_cast<float>(em.m_psnr);
						s.m_best_etc1s_luma_709_ssim = static_cast<float>(em.m_ssim);

						em.calc(m_slice_images[slice_index], m_best_etc1s_images_unpacked[slice_index], 0, 0, true, true);
						em.print("Unquantized ETC1S 601 Luma:    ");
						s.m_best_etc1s_luma_601_psnr = static_cast<float>(em.m_psnr);
					}
				}

				std::string out_basename;
				if (m_params.m_out_filename.size())
					string_get_filename(m_params.m_out_filename.c_str(), out_basename);
				else if (m_params.m_source_filenames.size())
					string_get_filename(m_params.m_source_filenames[slice_desc.m_source_file_index].c_str(), out_basename);

				string_remove_extension(out_basename);
				out_basename = "basis_debug_" + out_basename + string_format("_slice_%u", slice_index);

				if ((!m_params.m_uastc) && (m_frontend.get_params().m_debug_images))
				{
					// Write "best" ETC1S debug images
					if (!m_params.m_uastc)
					{
						gpu_image best_etc1s_gpu_image(m_best_etc1s_images[slice_index]);
						best_etc1s_gpu_image.override_dimensions(slice_desc.m_orig_width, slice_desc.m_orig_height);
						write_compressed_texture_file((out_basename + "_best_etc1s.ktx").c_str(), best_etc1s_gpu_image);

						image best_etc1s_unpacked;
						best_etc1s_gpu_image.unpack(best_etc1s_unpacked);
						save_png(out_basename + "_best_etc1s.png", best_etc1s_unpacked);
					}
				}

				if (m_params.m_debug_images)
				{
					// Write decoded ETC1S/ASTC debug images
					{
						gpu_image decoded_etc1s_or_astc(m_decoded_output_textures[slice_index]);
						decoded_etc1s_or_astc.override_dimensions(slice_desc.m_orig_width, slice_desc.m_orig_height);
						write_compressed_texture_file((out_basename + "_transcoded_etc1s_or_astc.ktx").c_str(), decoded_etc1s_or_astc);

						image temp(m_decoded_output_textures_unpacked[slice_index]);
						temp.crop(slice_desc.m_orig_width, slice_desc.m_orig_height);
						save_png(out_basename + "_transcoded_etc1s_or_astc.png", temp);
					}

					// Write decoded BC7 debug images
					if (m_decoded_output_textures_bc7[slice_index].get_pixel_width())
					{
						gpu_image decoded_bc7(m_decoded_output_textures_bc7[slice_index]);
						decoded_bc7.override_dimensions(slice_desc.m_orig_width, slice_desc.m_orig_height);
						write_compressed_texture_file((out_basename + "_transcoded_bc7.ktx").c_str(), decoded_bc7);

						image temp(m_decoded_output_textures_unpacked_bc7[slice_index]);
						temp.crop(slice_desc.m_orig_width, slice_desc.m_orig_height);
						save_png(out_basename + "_transcoded_bc7.png", temp);
					}
				}
			}
		} // if (m_params.m_validate_output_data)
				
		return true;
	}